

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::FormulasLoader::end__cn(FormulasLoader *this)

{
  pointer *pppIVar1;
  bool bVar2;
  iterator __position;
  ConstantExpression *pCVar3;
  ConstantExpression *this_00;
  FormulasLoader *this_01;
  _Elt_pointer pvVar4;
  ConstantExpression *local_30;
  
  bVar2 = this->mSepOccurred;
  this_01 = this;
  local_30 = createConstant(this,&this->mCurrentTextData);
  if (bVar2 == true) {
    pCVar3 = createConstant(this_01,&this->mCurrentTextDataAfterSep);
    this_00 = (ConstantExpression *)operator_new(0x28);
    MathML::AST::ArithmeticExpression::ArithmeticExpression((ArithmeticExpression *)this_00);
    (*(this_00->super_INode)._vptr_INode[6])(this_00,3);
    (*(this_00->super_INode)._vptr_INode[0xb])(this_00,local_30);
    (*(this_00->super_INode)._vptr_INode[0xb])(this_00,pCVar3);
    local_30 = this_00;
  }
  pvVar4 = (this->mNodeListStack).c.
           super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pvVar4 == (this->mNodeListStack).c.
                super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pvVar4 = (this->mNodeListStack).c.
             super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  __position._M_current =
       pvVar4[-1].super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      pvVar4[-1].super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>>::
    _M_realloc_insert<MathML::AST::INode*const&>
              ((vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>> *)(pvVar4 + -1),
               __position,(INode **)&local_30);
  }
  else {
    *__position._M_current = &local_30->super_INode;
    pppIVar1 = &pvVar4[-1].
                super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  this->mSepOccurred = false;
  (this->mCurrentTextDataAfterSep)._M_string_length = 0;
  *(this->mCurrentTextDataAfterSep)._M_dataplus._M_p = '\0';
  (this->mCurrentTextData)._M_string_length = 0;
  *(this->mCurrentTextData)._M_dataplus._M_p = '\0';
  return true;
}

Assistant:

bool FormulasLoader::end__cn()
	{
		MathML::AST::INode* node;

		if ( mSepOccurred )
		{
			// TODO support for other types than rational
			MathML::AST::ConstantExpression* constant1 = createConstant( mCurrentTextData );
			MathML::AST::ConstantExpression* constant2 = createConstant( mCurrentTextDataAfterSep );
			MathML::AST::ArithmeticExpression* expression = new MathML::AST::ArithmeticExpression();
			expression->setOperator( MathML::AST::ArithmeticExpression::DIV );
			expression->addOperand( constant1 );
			expression->addOperand( constant2 );
			node = expression;
		}
		else
		{
			MathML::AST::ConstantExpression* constant = createConstant( mCurrentTextData );
			node = constant;
		}

		mNodeListStack.top().push_back( node );
		mSepOccurred = false;
		mCurrentTextDataAfterSep.clear();
		mCurrentTextData.clear();

		return true;
	}